

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

vm_frameref_ext * __thiscall CVmObjFrameRef::alloc_ext(CVmObjFrameRef *this,int nlocals,int nparams)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  vm_frameref_ext *ext;
  size_t siz;
  vm_frameref_ext *pvVar3;
  
  if (*(long *)(in_RDI + 8) != 0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,*(undefined8 *)(in_RDI + 8));
  }
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,(long)(in_EDX + in_ESI + -1) * 0x10 + 0x68,in_RDI);
  pvVar3 = (vm_frameref_ext *)CONCAT44(extraout_var,iVar1);
  pvVar3->nlocals = in_ESI;
  pvVar3->nparams = in_EDX;
  *(vm_frameref_ext **)(in_RDI + 8) = pvVar3;
  return pvVar3;
}

Assistant:

vm_frameref_ext *CVmObjFrameRef::alloc_ext(VMG_ int nlocals, int nparams)
{
    /* delete any existing extension */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* figure the allocation size */
    size_t siz = sizeof(vm_frameref_ext)
                 + (nparams + nlocals - 1)*sizeof(vm_val_t);

    /* allocate the extension */
    vm_frameref_ext *ext =
        (vm_frameref_ext *)G_mem->get_var_heap()->alloc_mem(siz, this);

    /* save the variable counts */
    ext->nlocals = nlocals;
    ext->nparams = nparams;

    /* save the new extension in 'self' */
    ext_ = (char *)ext;

    /* return the new extension */
    return ext;
}